

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::AddSettingsHandler(ImGuiSettingsHandler *handler)

{
  int *piVar1;
  int iVar2;
  ImGuiSettingsHandler *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiSettingsHandler *__dest;
  int iVar5;
  int iVar6;
  ImGuiContext *ctx;
  
  pIVar4 = GImGui;
  iVar6 = (GImGui->SettingsHandlers).Size;
  iVar2 = (GImGui->SettingsHandlers).Capacity;
  if (iVar6 == iVar2) {
    iVar6 = iVar6 + 1;
    if (iVar2 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar2 / 2 + iVar2;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar2 < iVar6) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiSettingsHandler *)
               (*GImAllocatorAllocFunc)((long)iVar6 * 0x48,GImAllocatorUserData);
      pIVar3 = (pIVar4->SettingsHandlers).Data;
      if (pIVar3 != (ImGuiSettingsHandler *)0x0) {
        memcpy(__dest,pIVar3,(long)(pIVar4->SettingsHandlers).Size * 0x48);
        pIVar3 = (pIVar4->SettingsHandlers).Data;
        if ((pIVar3 != (ImGuiSettingsHandler *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
      }
      (pIVar4->SettingsHandlers).Data = __dest;
      (pIVar4->SettingsHandlers).Capacity = iVar6;
    }
  }
  memcpy((pIVar4->SettingsHandlers).Data + (pIVar4->SettingsHandlers).Size,handler,0x48);
  (pIVar4->SettingsHandlers).Size = (pIVar4->SettingsHandlers).Size + 1;
  return;
}

Assistant:

void ImGui::AddSettingsHandler(const ImGuiSettingsHandler* handler)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(FindSettingsHandler(handler->TypeName) == NULL);
    g.SettingsHandlers.push_back(*handler);
}